

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void cfd::core::ConvertFromUniValue(bool *value,UniValue *json_value)

{
  bool bVar1;
  undefined8 uVar2;
  UniValue *in_RSI;
  undefined8 in_RDI;
  char *in_stack_ffffffffffffff88;
  CfdSourceLocation *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  CfdError in_stack_ffffffffffffffac;
  CfdException *in_stack_ffffffffffffffb0;
  string local_48 [32];
  char *local_28;
  undefined4 local_20;
  char *local_18;
  undefined8 local_8;
  
  local_8 = in_RDI;
  bVar1 = UniValue::isBool(in_RSI);
  if (!bVar1) {
    local_28 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
                       ,0x2f);
    local_28 = local_28 + 1;
    local_20 = 0x76;
    local_18 = "ConvertFromUniValue";
    logger::warn<>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"Json value convert error. Invalid json format.",
               (allocator *)&stack0xffffffffffffffb7);
    CfdException::CfdException
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               (string *)CONCAT44(in_stack_ffffffffffffffa4,uVar3));
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = UniValue::getBool((UniValue *)0x4c60d8);
  *(bool *)local_8 = bVar1;
  return;
}

Assistant:

inline void ConvertFromUniValue(
    bool& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  if (json_value.isBool()) {
    value = json_value.getBool();
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}